

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

bool slang::ast::checkAssertionArg
               (PropertyExprSyntax *propExpr,AssertionPortSymbol *formal,ASTContext *context,
               ActualArg *result,bool isRecursiveProp)

{
  bool bVar1;
  int iVar2;
  ParenthesizedExpressionSyntax *pPVar3;
  SyntaxNode *this;
  Type *this_00;
  Type *pTVar4;
  Expression *pEVar5;
  undefined4 extraout_var_00;
  Symbol *this_01;
  ValueSymbol *this_02;
  Scope *pSVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Diagnostic *pDVar7;
  socklen_t __len;
  DiagCode code;
  undefined7 in_register_00000081;
  SourceRange SVar8;
  Expression *local_b0;
  SyntaxNode *local_a8;
  long local_a0;
  ASTContext ctx;
  undefined4 extraout_var;
  
  decomposePropExpr((ast *)&local_a8,propExpr);
  ctx.assertionInstance = context->assertionInstance;
  ctx.scope.ptr = (context->scope).ptr;
  ctx.lookupIndex = context->lookupIndex;
  ctx._12_4_ = *(undefined4 *)&context->field_0xc;
  ctx.flags.m_bits = (context->flags).m_bits;
  ctx.instanceOrProc = context->instanceOrProc;
  ctx.firstTempVar = context->firstTempVar;
  ctx.randomizeDetails = context->randomizeDetails;
  if (((int)CONCAT71(in_register_00000081,isRecursiveProp) != 0) &&
     ((formal->localVarDirection).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged == false)) {
    this = local_a8;
    if (local_a8 != (SyntaxNode *)0x0) {
      while (this->kind == ParenthesizedExpression) {
        pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>(this);
        this = &not_null<slang::syntax::ExpressionSyntax_*>::get(&pPVar3->expression)->
                super_SyntaxNode;
      }
      if (this->kind == IdentifierName) goto LAB_00317f29;
    }
    ctx.flags.m_bits = ctx.flags.m_bits | 0x2000000;
  }
LAB_00317f29:
  this_00 = DeclaredType::getType(&formal->declaredType);
  pTVar4 = Type::getCanonicalType(this_00);
  switch((pTVar4->super_Symbol).kind) {
  case EventType:
    iVar2 = TimingControl::bind((int)propExpr,(sockaddr *)&ctx,__len);
    pEVar5 = (Expression *)CONCAT44(extraout_var,iVar2);
    local_b0 = pEVar5;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                 *)result,(TimingControl **)&local_b0);
    goto LAB_00318140;
  default:
    if (local_a8 == (SyntaxNode *)0x0) {
      SVar8 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
      pDVar7 = ASTContext::addDiag(&ctx,(DiagCode)0x20007,SVar8);
LAB_0031819c:
      operator<<(pDVar7,this_00);
      return false;
    }
    iVar2 = Expression::bind((int)local_a8,(sockaddr *)&ctx,0);
    pEVar5 = (Expression *)CONCAT44(extraout_var_00,iVar2);
    bVar1 = Expression::bad(pEVar5);
    if (bVar1) {
      return false;
    }
    pTVar4 = not_null<const_slang::ast::Type_*>::get(&pEVar5->type);
    bVar1 = Type::isCastCompatible(this_00,pTVar4);
    if (!bVar1) {
      SVar8 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
      pDVar7 = ASTContext::addDiag(&ctx,(DiagCode)0x30007,SVar8);
      pTVar4 = not_null<const_slang::ast::Type_*>::get(&pEVar5->type);
      pDVar7 = operator<<(pDVar7,pTVar4);
      goto LAB_0031819c;
    }
    if (((formal->localVarDirection).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>
         ._M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged != true)
       || (1 < (formal->localVarDirection).
               super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload._M_value - Out
          )) {
LAB_00318052:
      local_b0 = pEVar5;
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                   *)result,&local_b0);
      return true;
    }
    this_01 = Expression::getSymbolReference(pEVar5,true);
    if ((this_01 != (Symbol *)0x0) && (this_01->kind == LocalAssertionVar)) {
      this_02 = Symbol::as<slang::ast::ValueSymbol>(this_01);
      pSVar6 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
      ValueSymbol::addDriver
                (this_02,Procedural,pEVar5,pSVar6->thisSym,(bitmask<slang::ast::AssignFlags>)0x80,
                 (SourceRange)ZEXT816(0),(EvalContext *)0x0);
      goto LAB_00318052;
    }
    SVar8 = pEVar5->sourceRange;
    code.subsystem = Expressions;
    code.code = 7;
    break;
  case UntypedType:
    if (local_a8 != (SyntaxNode *)0x0) {
      iVar2 = Expression::bind((int)local_a8,(sockaddr *)&ctx,0x800);
      local_b0 = (Expression *)CONCAT44(extraout_var_01,iVar2);
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                   *)result,&local_b0);
      bVar1 = Expression::bad((Expression *)CONCAT44(extraout_var_01,iVar2));
      return !bVar1;
    }
    ctx.flags.m_bits = ctx.flags.m_bits | 0x100000;
    goto LAB_00318121;
  case SequenceType:
    if (local_a0 != 0) {
      iVar2 = AssertionExpr::bind((int)local_a0,(sockaddr *)&ctx,0);
      local_b0 = (Expression *)CONCAT44(extraout_var_02,iVar2);
      if (local_b0->kind != Invalid) {
        AssertionExpr::requireSequence((AssertionExpr *)local_b0,&ctx);
        std::
        variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
        ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                     *)result,(AssertionExpr **)&local_b0);
        return true;
      }
      return false;
    }
    SVar8 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
    code.subsystem = Expressions;
    code.code = 4;
    break;
  case PropertyType:
LAB_00318121:
    iVar2 = AssertionExpr::bind((AssertionExpr *)propExpr,(int)&ctx,(sockaddr *)0x0,0);
    pEVar5 = (Expression *)CONCAT44(extraout_var_03,iVar2);
    local_b0 = pEVar5;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                 *)result,(AssertionExpr **)&local_b0);
LAB_00318140:
    return pEVar5->kind != Invalid;
  case ErrorType:
    goto LAB_003181a9;
  }
  ASTContext::addDiag(&ctx,code,SVar8);
LAB_003181a9:
  return false;
}

Assistant:

static bool checkAssertionArg(const PropertyExprSyntax& propExpr, const AssertionPortSymbol& formal,
                              const ASTContext& context,
                              AssertionInstanceExpression::ActualArg& result,
                              bool isRecursiveProp) {
    auto [seqExpr, regExpr] = decomposePropExpr(propExpr);

    ASTContext ctx = context;
    if (isRecursiveProp && !formal.isLocalVar()) {
        // For every recursive instance of property q in the declaration of property p,
        // each actual argument expression e of the instance must satisfy at least one
        // of the following conditions:
        // 1. e is itself a formal argument of p.
        // 2. No formal argument of p appears in e.
        // 3. e is bound to a local variable formal argument of q.
        if (!regExpr)
            ctx.flags |= ASTFlags::RecursivePropertyArg;
        else {
            auto expr = regExpr;
            while (expr->kind == SyntaxKind::ParenthesizedExpression)
                expr = expr->as<ParenthesizedExpressionSyntax>().expression;

            // This check filters out cases where the entire argument is a formal argument.
            if (expr->kind != SyntaxKind::IdentifierName)
                ctx.flags |= ASTFlags::RecursivePropertyArg;
        }
    }

    auto& type = formal.declaredType.getType();
    switch (type.getCanonicalType().kind) {
        case SymbolKind::UntypedType:
            // Untyped formals allow everything. Bind here just so we notice things like
            // name resolution errors even if the argument ends up being unused in the
            // body of the sequence / property.
            if (regExpr) {
                auto& bound = Expression::bind(*regExpr, ctx, ASTFlags::AllowUnboundedLiteral);
                result = &bound;
                return !bound.bad();
            }
            else {
                ctx.flags |= ASTFlags::AssertionInstanceArgCheck;
                auto& bound = AssertionExpr::bind(propExpr, ctx);
                result = &bound;
                return !bound.bad();
            }
        case SymbolKind::SequenceType: {
            if (!seqExpr) {
                ctx.addDiag(diag::AssertionArgTypeSequence, propExpr.sourceRange());
                return false;
            }

            auto& bound = AssertionExpr::bind(*seqExpr, ctx);
            if (bound.bad())
                return false;

            bound.requireSequence(ctx);
            result = &bound;
            return true;
        }
        case SymbolKind::PropertyType: {
            auto& bound = AssertionExpr::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::EventType: {
            auto& bound = TimingControl::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::ErrorType:
            return false;
        default:
            break;
    }

    // For all other types, we need a normal expression that
    // is cast compatible with the target type.
    if (!regExpr) {
        ctx.addDiag(diag::AssertionArgNeedsRegExpr, propExpr.sourceRange()) << type;
        return false;
    }

    auto& bound = Expression::bind(*regExpr, ctx);
    if (bound.bad())
        return false;

    if (!type.isCastCompatible(*bound.type)) {
        ctx.addDiag(diag::AssertionArgTypeMismatch, propExpr.sourceRange()) << *bound.type << type;
        return false;
    }

    // Local var formals that are output or inout must bind only to another local var.
    if (formal.localVarDirection == ArgumentDirection::InOut ||
        formal.localVarDirection == ArgumentDirection::Out) {
        auto sym = bound.getSymbolReference();
        if (!sym || sym->kind != SymbolKind::LocalAssertionVar) {
            ctx.addDiag(diag::AssertionOutputLocalVar, bound.sourceRange);
            return false;
        }

        sym->as<ValueSymbol>().addDriver(DriverKind::Procedural, bound, context.scope->asSymbol(),
                                         AssignFlags::AssertionLocalVarFormalArg);
    }

    result = &bound;
    return true;
}